

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizardPage::QWizardPage(QWizardPage *this,QWidget *parent)

{
  QWidget *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWizardPagePrivate *in_stack_ffffffffffffffd0;
  QObject *this_00;
  QWidget *pQVar1;
  QObject local_18 [12];
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  operator_new(0x318);
  QWizardPagePrivate::QWizardPagePrivate(in_stack_ffffffffffffffd0);
  local_c = 0;
  pQVar1 = in_RSI;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x7bcabc);
  QWidget::QWidget((QWidget *)in_stack_ffffffffffffffd0,in_RDI,in_RSI,
                   (QFlagsStorageHelper<Qt::WindowType,_4>)SUB84((ulong)pQVar1 >> 0x20,0));
  *(undefined ***)in_RDI = &PTR_metaObject_00d26848;
  *(undefined ***)&in_RDI->field_0x10 = &PTR__QWizardPage_00d26a20;
  this_00 = local_18;
  QObject::connect(this_00,(char *)in_RDI,(QObject *)"2completeChanged()",(char *)in_RDI,0xb339d1);
  QMetaObject::Connection::~Connection((Connection *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWizardPage::QWizardPage(QWidget *parent)
    : QWidget(*new QWizardPagePrivate, parent, { })
{
    connect(this, SIGNAL(completeChanged()), this, SLOT(_q_updateCachedCompleteState()));
}